

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeIncPruneBGPlanner.cpp
# Opt level: O2

void __thiscall
TreeIncPruneBGPlanner::AddToCache_CrossSum
          (TreeIncPruneBGPlanner *this,Index a,Index depth,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *jpol,VectorSet *G)

{
  mapped_type *this_00;
  string key;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  if (this->_m_useVectorCache == true) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"CrossSum",&local_69);
    ComputeKey(&local_48,this,a,depth,jpol,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>_>
              ::operator[](&this->_m_vectorSetCache,&local_48);
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::operator=(this_00,G);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void TreeIncPruneBGPlanner::AddToCache_CrossSum(Index a,
                                                Index depth,
                                                const vector<vector<Index> > &jpol,
                                                const VectorSet &G)
{
    if(!_m_useVectorCache)
        return;

    string key=ComputeKey(a,depth,jpol,"CrossSum");

#if DEBUG_TreeIncPruneBGPlannerVerbose
    cout << "Adding CrossSum node to cache with key " << key 
#endif
#if 0
         << " vectorset " << SoftPrint(G) 
#endif
#if DEBUG_TreeIncPruneBGPlannerVerbose
         << " (jpol " << SoftPrintJpol(jpol) << ")" << endl;
#endif
    _m_vectorSetCache[key]=G;//.insert(std::pair<key,G>);
}